

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reduction.cpp
# Opt level: O0

void CoreMLConverter::convertCaffeReduction(ConvertLayerParameters layerParameters)

{
  bool bVar1;
  int iVar2;
  int32 iVar3;
  ReductionParameter_ReductionOp RVar4;
  string *psVar5;
  string *psVar6;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar7;
  reference __x;
  NetParameter *in_stack_00000008;
  allocator local_151;
  string local_150;
  ReduceLayerParams *local_130;
  ReduceLayerParams *specLayerParams;
  allocator local_101;
  string local_100;
  ReductionParameter *local_e0;
  ReductionParameter *caffeLayerParams;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *topName;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *bottomName;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  allocator local_51;
  string local_50;
  NeuralNetworkLayer *local_30;
  NeuralNetworkLayer *specLayer;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *nnWrite;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *mappingDataBlobNames;
  LayerParameter *caffeLayer;
  int layerId;
  
  caffeLayer._4_4_ = *(int *)&((layerParameters.caffeNetworkInputNames)->_M_t)._M_impl;
  mappingDataBlobNames =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)caffe::NetParameter::layer(in_stack_00000008,caffeLayer._4_4_);
  nnWrite = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)layerParameters._24_8_;
  specLayer = (NeuralNetworkLayer *)layerParameters.protoweights;
  local_30 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                       ((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
                        layerParameters.protoweights);
  iVar2 = caffe::LayerParameter::bottom_size((LayerParameter *)mappingDataBlobNames);
  if ((iVar2 != 1) ||
     (iVar2 = caffe::LayerParameter::top_size((LayerParameter *)mappingDataBlobNames), iVar2 != 1))
  {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,"Must have 1 input and 1 output",&local_51);
    psVar5 = caffe::LayerParameter::name_abi_cxx11_((LayerParameter *)mappingDataBlobNames);
    psVar6 = caffe::LayerParameter::type_abi_cxx11_((LayerParameter *)mappingDataBlobNames);
    errorInCaffeProto(&local_50,psVar5,psVar6);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&top.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
  pRVar7 = caffe::LayerParameter::bottom_abi_cxx11_((LayerParameter *)mappingDataBlobNames);
  __end1 = google::protobuf::
           RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::begin(pRVar7);
  bottomName = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               google::protobuf::
               RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::end(pRVar7);
  while (bVar1 = google::protobuf::internal::
                 RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator!=(&__end1,(iterator *)&bottomName), bVar1) {
    __x = google::protobuf::internal::
          RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*(&__end1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&top.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,__x);
    google::protobuf::internal::
    RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  pRVar7 = caffe::LayerParameter::top_abi_cxx11_((LayerParameter *)mappingDataBlobNames);
  __end1_1 = google::protobuf::
             RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::begin(pRVar7);
  topName = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            google::protobuf::
            RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::end(pRVar7);
  while (bVar1 = google::protobuf::internal::
                 RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator!=(&__end1_1,(iterator *)&topName), bVar1) {
    caffeLayerParams =
         (ReductionParameter *)
         google::protobuf::internal::
         RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ::operator*(&__end1_1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range1,(value_type *)caffeLayerParams);
    google::protobuf::internal::
    RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1_1);
  }
  psVar5 = caffe::LayerParameter::name_abi_cxx11_((LayerParameter *)mappingDataBlobNames);
  convertCaffeMetadata
            (psVar5,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&top.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1,(RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)specLayer,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)nnWrite);
  local_e0 = caffe::LayerParameter::reduction_param((LayerParameter *)mappingDataBlobNames);
  iVar3 = caffe::ReductionParameter::axis(local_e0);
  if (iVar3 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_100,"axis",&local_101);
    psVar5 = caffe::LayerParameter::name_abi_cxx11_((LayerParameter *)mappingDataBlobNames);
    psVar6 = caffe::LayerParameter::type_abi_cxx11_((LayerParameter *)mappingDataBlobNames);
    iVar3 = caffe::ReductionParameter::axis(local_e0);
    std::__cxx11::to_string((string *)&specLayerParams,iVar3);
    unsupportedCaffeParrameterWithOption(&local_100,psVar5,psVar6,(string *)&specLayerParams);
    std::__cxx11::string::~string((string *)&specLayerParams);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
  }
  local_130 = CoreML::Specification::NeuralNetworkLayer::mutable_reduce(local_30);
  RVar4 = caffe::ReductionParameter::operation(local_e0);
  switch(RVar4) {
  case ReductionParameter_ReductionOp_SUM:
    CoreML::Specification::ReduceLayerParams::set_mode
              (local_130,ReduceLayerParams_ReduceOperation_SUM);
    break;
  case ReductionParameter_ReductionOp_ASUM:
    CoreML::Specification::ReduceLayerParams::set_mode
              (local_130,ReduceLayerParams_ReduceOperation_L1);
    break;
  case ReductionParameter_ReductionOp_SUMSQ:
    CoreML::Specification::ReduceLayerParams::set_mode
              (local_130,ReduceLayerParams_ReduceOperation_SUMSQUARE);
    break;
  case ReductionParameter_ReductionOp_MEAN:
    CoreML::Specification::ReduceLayerParams::set_mode
              (local_130,ReduceLayerParams_ReduceOperation_AVG);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_150,"operation not set",&local_151);
    psVar5 = caffe::LayerParameter::name_abi_cxx11_((LayerParameter *)mappingDataBlobNames);
    psVar6 = caffe::LayerParameter::type_abi_cxx11_((LayerParameter *)mappingDataBlobNames);
    errorInCaffeProto(&local_150,psVar5,psVar6);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&top.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeReduction(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    for (const auto& bottomName: caffeLayer.bottom()){
        bottom.push_back(bottomName);
    }
    for (const auto& topName: caffeLayer.top()){
        top.push_back(topName);
    }
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(), 
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    const caffe::ReductionParameter& caffeLayerParams = caffeLayer.reduction_param();
    
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayerParams.axis() != 0){
        CoreMLConverter::unsupportedCaffeParrameterWithOption("axis",caffeLayer.name(),caffeLayer.type(),std::to_string(caffeLayerParams.axis()));
    }
    //***************************************************************
    
    Specification::ReduceLayerParams* specLayerParams = specLayer->mutable_reduce();
    switch(caffeLayerParams.operation()) {
        case caffe::ReductionParameter::ASUM:
            specLayerParams->set_mode(Specification::ReduceLayerParams::L1);
            break;
        case caffe::ReductionParameter::SUM:
            specLayerParams->set_mode(Specification::ReduceLayerParams::SUM);
            break;
        case caffe::ReductionParameter::SUMSQ:
            specLayerParams->set_mode(Specification::ReduceLayerParams::SUMSQUARE);
            break;
        case caffe::ReductionParameter::MEAN:
            specLayerParams->set_mode(Specification::ReduceLayerParams::AVG);
            break;
        default:
            CoreMLConverter::errorInCaffeProto("operation not set",caffeLayer.name(), caffeLayer.type());
    }
}